

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Emplace<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
::TestBody(Emplace<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  pointer *__ptr;
  _func_int **message;
  char *message_00;
  tuple<const_int_&> *args_1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *args_1_00;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_810;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_808;
  _Head_base<0UL,_const_phmap::priv::NonStandardLayout_&,_false> local_800;
  undefined1 local_7f8 [8];
  _Head_base<0UL,_const_phmap::priv::NonStandardLayout_&,_false> _Stack_7f0;
  undefined1 local_7e8 [8];
  undefined1 auStack_7e0 [24];
  bool local_7c8;
  AssertHelper local_7c0;
  Message local_7b8;
  undefined1 local_7b0 [8];
  long *local_7a8;
  long local_798 [2];
  pair<const_int,_phmap::priv::NonStandardLayout> local_788;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  local_758;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_720;
  
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_788,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)&local_720);
  lVar3 = 0x68;
  do {
    *(undefined8 *)((long)&local_758.first.inner_ + lVar3) = 0;
    *(undefined8 *)((long)local_720.sets_._M_elems + lVar3 + -0x30) = 0;
    *(undefined8 *)((long)&local_788.second.value + lVar3 + 0x10U) = 0;
    *(undefined8 *)((long)&local_788.second.value + lVar3 + 0x18U) = 0;
    *(undefined8 *)((long)&local_788.second.value + lVar3) = 0;
    *(undefined8 *)((long)&local_788.second.value + lVar3 + 8U) = 0;
    *(undefined8 *)((long)&local_788.first + lVar3) = 0;
    *(undefined8 *)((long)&local_788.second._vptr_NonStandardLayout + lVar3) = 0;
    *(undefined8 *)((long)local_720.sets_._M_elems + lVar3 + -0x28) = 0;
    *(undefined8 *)((long)local_720.sets_._M_elems + lVar3 + -0x18) = 0;
    *(long *)((long)local_720.sets_._M_elems + lVar3 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_720.sets_._M_elems + lVar3 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_720.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x768);
  _Stack_7f0._M_head_impl = &local_788.second;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_788.first;
  args_1 = (tuple<const_int_&> *)local_7f8;
  local_7f8 = (undefined1  [8])&local_788;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<phmap::priv::NonStandardLayout_const&>>
            (&local_758,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_720,&local_788.first,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,args_1,
             (tuple<const_phmap::priv::NonStandardLayout_&> *)&_Stack_7f0);
  local_7b8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_7b8.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_758.second);
  local_7b0 = (undefined1  [8])0x0;
  if (local_758.second == false) {
    testing::Message::Message((Message *)&local_808);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7f8,(internal *)&local_7b8,(AssertionResult *)"p.second","false",
               "true",(char *)args_1);
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x88,(char *)local_7f8);
    testing::internal::AssertHelper::operator=(&local_810,(Message *)&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    if (local_7f8 != (undefined1  [8])local_7e8) {
      operator_delete((void *)local_7f8,(ulong)((long)local_7e8 + 1));
    }
    if (local_808._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_808._M_head_impl + 8))();
    }
  }
  if (local_7b0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_7b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b0);
  }
  testing::internal::
  CmpHelperEQ<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((internal *)local_7f8,"val","*p.first",&local_788,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_758.first.it_.field_1.slot_);
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message(&local_7b8);
    if ((Inner *)_Stack_7f0._M_head_impl == (Inner *)0x0) {
      message = (_func_int **)0x2dfbbf;
    }
    else {
      message = (_func_int **)
                (((Lockable *)&(_Stack_7f0._M_head_impl)->_vptr_NonStandardLayout)->super_mutex).
                super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x89,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_808,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_808);
    if ((long *)CONCAT44(local_7b8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_7b8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_7b8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_7b8.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if ((Inner *)_Stack_7f0._M_head_impl != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_7f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_7f0._M_head_impl);
  }
  hash_internal::Generator<phmap::priv::NonStandardLayout,_void>::operator()
            ((NonStandardLayout *)local_7f8,
             (Generator<phmap::priv::NonStandardLayout,_void> *)&local_808);
  local_7b8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_788.first;
  local_7b0 = (undefined1  [8])&PTR__NonStandardLayout_0034b120;
  local_7a8 = local_798;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a8,_Stack_7f0._M_head_impl,
             (ctrl_t *)
             ((long)&(((Lockable *)&(_Stack_7f0._M_head_impl)->_vptr_NonStandardLayout)->super_mutex
                     ).super___mutex_base._M_mutex + (long)local_7e8));
  local_7f8 = (undefined1  [8])&PTR__NonStandardLayout_0034b120;
  if ((Inner *)_Stack_7f0._M_head_impl != (Inner *)(local_7e8 + 8)) {
    operator_delete(_Stack_7f0._M_head_impl,(ulong)(auStack_7e0._0_8_ + 1));
  }
  local_808._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7b8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)local_7b8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
  args_1_00 = &local_808;
  local_800._M_head_impl = (NonStandardLayout *)local_7b0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<phmap::priv::NonStandardLayout_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
              *)local_7f8,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_720,(int *)local_808._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)args_1_00,
             (tuple<const_phmap::priv::NonStandardLayout_&> *)&local_800);
  local_758.first.inner_ = (Inner *)local_7f8;
  local_758.first.inner_end_ = (Inner *)_Stack_7f0._M_head_impl;
  local_758.first.it_.ctrl_ = (ctrl_t *)local_7e8;
  local_758.first.it_.field_1.slot_ = (slot_type *)auStack_7e0._0_8_;
  local_758.first.it_end_.ctrl_ = (ctrl_t *)auStack_7e0._8_8_;
  local_758.first.it_end_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)auStack_7e0._16_8_;
  local_758.second = local_7c8;
  local_808._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_808._M_head_impl._1_7_,local_7c8) ^ 1);
  local_800._M_head_impl = (NonStandardLayout *)0x0;
  if (local_7c8 != false) {
    testing::Message::Message((Message *)&local_810);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7f8,(internal *)&local_808,(AssertionResult *)"p.second","true",
               "false",(char *)args_1_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x8c,(char *)local_7f8);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    if (local_7f8 != (undefined1  [8])local_7e8) {
      operator_delete((void *)local_7f8,(ulong)((long)local_7e8 + 1));
    }
    if (local_810.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_810.data_ + 8))();
    }
  }
  if (local_800._M_head_impl != (NonStandardLayout *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_800,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_800._M_head_impl);
  }
  testing::internal::
  CmpHelperEQ<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((internal *)local_7f8,"val","*p.first",&local_788,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_758.first.it_.field_1.slot_);
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_808);
    if ((Inner *)_Stack_7f0._M_head_impl == (Inner *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = (char *)(((Lockable *)&(_Stack_7f0._M_head_impl)->_vptr_NonStandardLayout)->
                           super_mutex).super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x8d,message_00);
    testing::internal::AssertHelper::operator=(&local_810,(Message *)&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    if (local_808._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_808._M_head_impl + 8))();
    }
  }
  if ((Inner *)_Stack_7f0._M_head_impl != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_7f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_7f0._M_head_impl);
  }
  local_7b0 = (undefined1  [8])&PTR__NonStandardLayout_0034b120;
  if (local_7a8 != local_798) {
    operator_delete(local_7a8,local_798[0] + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_720);
  local_788.second._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0034b120;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.second.value._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_788.second.value + 0x10U)) {
    operator_delete(local_788.second.value._M_dataplus._M_p,
                    local_788.second.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Emplace) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto p = m.emplace(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.emplace(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}